

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

void restore_dig_status(memfile *mf)

{
  mfmagic_check(mf,0x53474944);
  digging.effort = mread32(mf);
  digging.lastdigtime = mread32(mf);
  digging.level.dnum = mread8(mf);
  digging.level.dlevel = mread8(mf);
  digging.pos.x = mread8(mf);
  digging.pos.y = mread8(mf);
  digging.down = mread8(mf);
  digging.chew = mread8(mf);
  digging.warned = mread8(mf);
  digging.quiet = mread8(mf);
  return;
}

Assistant:

void restore_dig_status(struct memfile *mf)
{
    mfmagic_check(mf, DIG_MAGIC);
    digging.effort = mread32(mf);
    digging.lastdigtime = mread32(mf);
    digging.level.dnum = mread8(mf);
    digging.level.dlevel = mread8(mf);
    digging.pos.x = mread8(mf);
    digging.pos.y = mread8(mf);
    digging.down = mread8(mf);
    digging.chew = mread8(mf);
    digging.warned = mread8(mf);
    digging.quiet = mread8(mf);
}